

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall
argparse::ArgumentParser::parse_args_internal
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aArguments)

{
  _Rb_tree_header *p_Var1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  _Base_ptr p_Var2;
  char *pcVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  const_iterator cVar6;
  _List_iterator<argparse::Argument> _Var7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  start;
  ulong uVar8;
  runtime_error *prVar9;
  ostream *poVar10;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  ulong uVar11;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  *__const_this;
  pointer pbVar12;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  start_00;
  _Self __tmp;
  _List_node_base *p_Var13;
  string_view aName;
  string tHypotheticalArgument;
  
  pbVar12 = (aArguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (((this->mProgramName)._M_string_length == 0) &&
     (pbVar12 !=
      (aArguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::_M_assign((string *)this);
    pbVar12 = (aArguments->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    in_RDX = extraout_RDX;
  }
  end._M_current =
       (aArguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  p_Var1 = &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header;
  start._M_current = pbVar12 + 1;
  p_Var13 = (this->mPositionalArguments).
            super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl.
            _M_node.super__List_node_base._M_next;
LAB_001160b2:
  while( true ) {
    while( true ) {
      start_00._M_current = start._M_current;
      if (start_00._M_current == end._M_current) {
        return;
      }
      aName._M_str = in_RDX;
      aName._M_len = (size_t)((start_00._M_current)->_M_dataplus)._M_p;
      bVar5 = Argument::is_positional((Argument *)(start_00._M_current)->_M_string_length,aName);
      if (!bVar5) break;
      if (p_Var13 == (_List_node_base *)&this->mPositionalArguments) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"Maximum number of positional arguments exceeded");
        goto LAB_0011626c;
      }
      p_Var4 = p_Var13->_M_next;
      start = Argument::
              consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((Argument *)(p_Var13 + 1),start_00,end,(string_view)ZEXT816(0));
      in_RDX = extraout_RDX_03;
      p_Var13 = p_Var4;
    }
    cVar6 = std::
            _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
            ::_M_find_tr<std::__cxx11::string,void>
                      ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                        *)&this->mArgumentMap,start_00._M_current);
    if ((_Rb_tree_header *)cVar6._M_node != p_Var1) break;
    uVar8 = (start_00._M_current)->_M_string_length;
    if (((uVar8 < 2) || (pcVar3 = ((start_00._M_current)->_M_dataplus)._M_p, *pcVar3 != '-')) ||
       (pcVar3[1] == '-')) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"Unknown argument");
LAB_0011626c:
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    start._M_current = start_00._M_current + 1;
    in_RDX = extraout_RDX_00;
    for (uVar11 = 1; uVar11 < uVar8; uVar11 = uVar11 + 1) {
      tHypotheticalArgument._M_dataplus._M_p = (pointer)&tHypotheticalArgument.field_2;
      tHypotheticalArgument.field_2._M_allocated_capacity._0_2_ =
           (ushort)(byte)((start_00._M_current)->_M_dataplus)._M_p[uVar11] << 8 | 0x2d;
      tHypotheticalArgument._M_string_length = 2;
      tHypotheticalArgument.field_2._M_local_buf[2] = '\0';
      cVar6 = std::
              _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
              ::_M_find_tr<std::__cxx11::string,void>
                        ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                          *)&this->mArgumentMap,&tHypotheticalArgument);
      if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"Unknown argument");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      start = Argument::
              consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((Argument *)&(cVar6._M_node[1]._M_left)->_M_left,start,end,
                         *(string_view *)(cVar6._M_node + 1));
      std::__cxx11::string::~string((string *)&tHypotheticalArgument);
      uVar8 = (start_00._M_current)->_M_string_length;
      in_RDX = extraout_RDX_02;
    }
  }
  p_Var2 = cVar6._M_node[1]._M_left;
  _Var7._M_node =
       (this->mOptionalArguments).
       super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
       super__List_node_base._M_next;
  if ((_Base_ptr)_Var7._M_node == p_Var2) {
    argparse::operator<<((ostream *)&std::cout,this);
  }
  else {
    _Var7 = std::next<std::_List_iterator<argparse::Argument>>(_Var7,1);
    if ((_Base_ptr)_Var7._M_node != p_Var2) {
      start = Argument::
              consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((Argument *)&p_Var2->_M_left,start_00._M_current + 1,end,
                         *(string_view *)(cVar6._M_node + 1));
      in_RDX = extraout_RDX_01;
      goto LAB_001160b2;
    }
    poVar10 = std::operator<<((ostream *)&std::cout,(string *)&this->mVersion);
    std::operator<<(poVar10,"\n");
  }
  exit(0);
}

Assistant:

void parse_args_internal(const std::vector<std::string> &aArguments) {
    if (mProgramName.empty() && !aArguments.empty()) {
      mProgramName = aArguments.front();
    }
    auto end = std::end(aArguments);
    auto positionalArgumentIt = std::begin(mPositionalArguments);
    for (auto it = std::next(std::begin(aArguments)); it != end;) {
      const auto &tCurrentArgument = *it;
      if (Argument::is_positional(tCurrentArgument)) {
        if (positionalArgumentIt == std::end(mPositionalArguments)) {
          throw std::runtime_error(
              "Maximum number of positional arguments exceeded");
        }
        auto tArgument = positionalArgumentIt++;
        it = tArgument->consume(it, end);
        continue;
      }

      auto tIterator = mArgumentMap.find(tCurrentArgument);
      if (tIterator != mArgumentMap.end()) {
        auto tArgument = tIterator->second;

        // the first optional argument is --help
        if (tArgument == mOptionalArguments.begin()) {
          std::cout << *this;
          std::exit(0);
        }
        // the second optional argument is --version 
        else if (tArgument == std::next(mOptionalArguments.begin(), 1)) {
          std::cout << mVersion << "\n";
          std::exit(0);
        }

        it = tArgument->consume(std::next(it), end, tIterator->first);
      } else if (const auto &tCompoundArgument = tCurrentArgument;
                 tCompoundArgument.size() > 1 && tCompoundArgument[0] == '-' &&
                 tCompoundArgument[1] != '-') {
        ++it;
        for (size_t j = 1; j < tCompoundArgument.size(); j++) {
          auto tHypotheticalArgument = std::string{'-', tCompoundArgument[j]};
          auto tIterator2 = mArgumentMap.find(tHypotheticalArgument);
          if (tIterator2 != mArgumentMap.end()) {
            auto tArgument = tIterator2->second;
            it = tArgument->consume(it, end, tIterator2->first);
          } else {
            throw std::runtime_error("Unknown argument");
          }
        }
      } else {
        throw std::runtime_error("Unknown argument");
      }
    }
  }